

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O3

QMdiArea * __thiscall QMdiSubWindow::mdiArea(QMdiSubWindow *this)

{
  long lVar1;
  QAbstractScrollArea *this_00;
  QWidget *pQVar2;
  
  lVar1 = *(long *)(*(long *)&(this->super_QWidget).field_0x8 + 0x10);
  while( true ) {
    if (lVar1 == 0) {
      return (QMdiArea *)0x0;
    }
    this_00 = (QAbstractScrollArea *)QMetaObject::cast((QObject *)&QMdiArea::staticMetaObject);
    if ((this_00 != (QAbstractScrollArea *)0x0) &&
       (pQVar2 = QAbstractScrollArea::viewport(this_00),
       pQVar2 == *(QWidget **)(*(long *)&(this->super_QWidget).field_0x8 + 0x10))) break;
    lVar1 = *(long *)(*(long *)(lVar1 + 8) + 0x10);
  }
  return (QMdiArea *)this_00;
}

Assistant:

T *operator->() const noexcept
    {
        return d;
    }